

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::OP_InitProto(Var instance,PropertyId propertyId,Var value)

{
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *object;
  RecyclableObject *newPrototype;
  
  bVar3 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1cde,"(VarIs<RecyclableObject>(instance))",
                                "__proto__ member on a non-object?");
    if (!bVar3) goto LAB_009a5523;
    *puVar5 = 0;
  }
  if (propertyId != 0x1eb) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1cdf,"(propertyId == PropertyIds::__proto__)",
                                "propertyId == PropertyIds::__proto__");
    if (!bVar3) {
LAB_009a5523:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  object = VarTo<Js::RecyclableObject>(instance);
  scriptContext =
       (((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
       ptr;
  pTVar1 = scriptContext->threadContext;
  bVar3 = pTVar1->noJsReentrancy;
  pTVar1->noJsReentrancy = true;
  BVar4 = IsObjectOrNull(value);
  if (BVar4 != 0) {
    newPrototype = VarTo<Js::RecyclableObject>(value);
    JavascriptObject::ChangePrototype(object,newPrototype,false,scriptContext);
  }
  pTVar1->noJsReentrancy = bVar3;
  return;
}

Assistant:

void JavascriptOperators::OP_InitProto(Var instance, PropertyId propertyId, Var value)
    {
        AssertMsg(VarIs<RecyclableObject>(instance), "__proto__ member on a non-object?");
        Assert(propertyId == PropertyIds::__proto__);

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        ScriptContext* scriptContext = object->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_InitProto, reentrancylock, scriptContext->GetThreadContext());

        // B.3.1    __proto___ Property Names in Object Initializers
        //6.If propKey is the string value "__proto__" and if isComputedPropertyName(propKey) is false, then
        //    a.If Type(v) is either Object or Null, then
        //        i.Return the result of calling the [[SetInheritance]] internal method of object with argument propValue.
        //    b.Return NormalCompletion(empty).
        if (JavascriptOperators::IsObjectOrNull(value))
        {
            JavascriptObject::ChangePrototype(object, VarTo<RecyclableObject>(value), /*validate*/false, scriptContext);
        }
        JIT_HELPER_END(OP_InitProto);
    }